

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

void xmlSAX2AttributeNs(xmlParserCtxtPtr ctxt,xmlChar *localname,xmlChar *prefix,xmlChar *value,
                       xmlChar *valueend)

{
  _xmlDoc *p_Var1;
  _xmlNode *p_Var2;
  uint uVar3;
  int iVar4;
  xmlNsPtr ns;
  xmlChar *pxVar5;
  xmlNodePtr attr;
  xmlRegisterNodeFunc *pp_Var6;
  xmlNodePtr pxVar7;
  xmlChar *name;
  xmlChar *pxVar8;
  _xmlNode *p_Var9;
  int iVar10;
  xmlChar fn [50];
  xmlChar local_68 [56];
  
  if (prefix == (xmlChar *)0x0) {
    ns = (xmlNsPtr)0x0;
  }
  else {
    ns = xmlSearchNs(ctxt->myDoc,ctxt->node,prefix);
  }
  attr = (xmlNodePtr)ctxt->freeAttrs;
  if (attr == (xmlNodePtr)0x0) {
    if (ctxt->dictNames == 0) {
      attr = (xmlNodePtr)xmlNewNsProp(ctxt->node,ns,localname,(xmlChar *)0x0);
    }
    else {
      attr = (xmlNodePtr)xmlNewNsPropEatName(ctxt->node,ns,localname,(xmlChar *)0x0);
    }
    if (attr == (xmlNodePtr)0x0) {
      xmlErrMemory(ctxt,"xmlSAX2AttributeNs");
      return;
    }
  }
  else {
    ctxt->freeAttrs = (xmlAttrPtr)attr->next;
    ctxt->freeAttrsNr = ctxt->freeAttrsNr + -1;
    attr->_private = (void *)0x0;
    *(undefined8 *)&attr->type = 0;
    attr->content = (xmlChar *)0x0;
    attr->properties = (_xmlAttr *)0x0;
    attr->doc = (_xmlDoc *)0x0;
    attr->ns = (xmlNs *)0x0;
    attr->next = (_xmlNode *)0x0;
    attr->prev = (_xmlNode *)0x0;
    attr->last = (_xmlNode *)0x0;
    attr->parent = (_xmlNode *)0x0;
    attr->name = (xmlChar *)0x0;
    attr->children = (_xmlNode *)0x0;
    attr->type = XML_ATTRIBUTE_NODE;
    p_Var9 = ctxt->node;
    attr->parent = p_Var9;
    attr->doc = ctxt->myDoc;
    attr->ns = ns;
    pxVar5 = localname;
    if (ctxt->dictNames == 0) {
      pxVar5 = xmlStrdup(localname);
      p_Var9 = ctxt->node;
    }
    attr->name = pxVar5;
    p_Var2 = (_xmlNode *)p_Var9->properties;
    if ((_xmlNode *)p_Var9->properties == (_xmlNode *)0x0) {
      p_Var9->properties = (_xmlAttr *)attr;
    }
    else {
      do {
        p_Var9 = p_Var2;
        p_Var2 = p_Var9->next;
      } while (p_Var9->next != (_xmlNode *)0x0);
      p_Var9->next = attr;
      attr->prev = p_Var9;
    }
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var6 = __xmlRegisterNodeDefaultValue(), *pp_Var6 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var6 = __xmlRegisterNodeDefaultValue();
      (**pp_Var6)(attr);
    }
  }
  iVar4 = (int)valueend;
  iVar10 = (int)value;
  if ((ctxt->replaceEntities == 0) && (ctxt->html == 0)) {
    if (*valueend == '\0') {
      pxVar7 = xmlStringLenGetNodeList(ctxt->myDoc,value,iVar4 - iVar10);
      attr->children = pxVar7;
      if (pxVar7 != (xmlNodePtr)0x0) {
        p_Var1 = attr->doc;
        do {
          p_Var9 = pxVar7;
          p_Var9->doc = p_Var1;
          p_Var9->parent = attr;
          pxVar7 = p_Var9->next;
        } while (p_Var9->next != (_xmlNode *)0x0);
        attr->last = p_Var9;
      }
    }
    else {
LAB_0017c4f9:
      pxVar7 = xmlSAX2TextNode(ctxt,value,iVar4 - iVar10);
      attr->children = pxVar7;
      attr->last = pxVar7;
      if (pxVar7 != (xmlNodePtr)0x0) {
        pxVar7->doc = attr->doc;
        pxVar7->parent = attr;
      }
    }
  }
  else if (value != (xmlChar *)0x0) goto LAB_0017c4f9;
  if ((((ctxt->html != 0) || (ctxt->validate == 0)) || (ctxt->wellFormed == 0)) ||
     ((ctxt->myDoc == (xmlDocPtr)0x0 || (ctxt->myDoc->intSubset == (_xmlDtd *)0x0)))) {
    if ((ctxt->loadsubset & 8) != 0) {
      return;
    }
    if (ctxt->replaceEntities == 0) {
      if (ctxt->external == 2) {
        return;
      }
    }
    else if (ctxt->inSubset != 0) {
      return;
    }
    p_Var9 = attr->children;
    if (p_Var9 == (_xmlNode *)0x0) {
      return;
    }
    if (p_Var9->type != XML_TEXT_NODE) {
      return;
    }
    if (p_Var9->next != (_xmlNode *)0x0) {
      return;
    }
    pxVar5 = p_Var9->content;
    if (((ctxt->str_xml == prefix) && (*localname == 'i')) &&
       ((localname[1] == 'd' && (localname[2] == '\0')))) {
      iVar4 = xmlValidateNCName(pxVar5,1);
      if (iVar4 != 0) {
        xmlErrValid(ctxt,XML_DTD_XMLID_VALUE,"xml:id : attribute value %s is not an NCName\n",
                    (char *)pxVar5,(char *)0x0);
      }
    }
    else {
      iVar4 = xmlIsID(ctxt->myDoc,ctxt->node,(xmlAttrPtr)attr);
      if (iVar4 == 0) {
        iVar4 = xmlIsRef(ctxt->myDoc,ctxt->node,(xmlAttrPtr)attr);
        if (iVar4 == 0) {
          return;
        }
        xmlAddRef(&ctxt->vctxt,ctxt->myDoc,pxVar5,(xmlAttrPtr)attr);
        return;
      }
    }
    xmlAddID(&ctxt->vctxt,ctxt->myDoc,pxVar5,(xmlAttrPtr)attr);
    return;
  }
  if (ctxt->replaceEntities == 0) {
    pxVar5 = xmlSAX2DecodeAttrEntities(ctxt,value,valueend);
    if (pxVar5 != (xmlChar *)0x0) {
      if (ctxt->attsSpecial != (xmlHashTablePtr)0x0) {
        name = xmlBuildQName(localname,prefix,local_68,0x32);
        if (name != (xmlChar *)0x0) {
          (ctxt->vctxt).valid = 1;
          pxVar8 = xmlValidCtxtNormalizeAttributeValue
                             (&ctxt->vctxt,ctxt->myDoc,ctxt->node,name,pxVar5);
          if ((ctxt->vctxt).valid != 1) {
            ctxt->valid = 0;
          }
          if (name != localname && name != local_68) {
            (*xmlFree)(name);
          }
          if (pxVar8 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar5);
            pxVar5 = pxVar8;
          }
        }
      }
      uVar3 = xmlValidateOneAttribute(&ctxt->vctxt,ctxt->myDoc,ctxt->node,(xmlAttrPtr)attr,pxVar5);
      ctxt->valid = ctxt->valid & uVar3;
      goto LAB_0017c7f8;
    }
    if (*valueend == '\0') {
      uVar3 = xmlValidateOneAttribute(&ctxt->vctxt,ctxt->myDoc,ctxt->node,(xmlAttrPtr)attr,value);
      ctxt->valid = ctxt->valid & uVar3;
      return;
    }
  }
  pxVar5 = xmlStrndup(value,iVar4 - iVar10);
  uVar3 = xmlValidateOneAttribute(&ctxt->vctxt,ctxt->myDoc,ctxt->node,(xmlAttrPtr)attr,pxVar5);
  ctxt->valid = ctxt->valid & uVar3;
  if (pxVar5 == (xmlChar *)0x0) {
    return;
  }
LAB_0017c7f8:
  (*xmlFree)(pxVar5);
  return;
}

Assistant:

static void
xmlSAX2AttributeNs(xmlParserCtxtPtr ctxt,
                   const xmlChar * localname,
                   const xmlChar * prefix,
		   const xmlChar * value,
		   const xmlChar * valueend)
{
    xmlAttrPtr ret;
    xmlNsPtr namespace = NULL;
    xmlChar *dup = NULL;

    /*
     * Note: if prefix == NULL, the attribute is not in the default namespace
     */
    if (prefix != NULL)
	namespace = xmlSearchNs(ctxt->myDoc, ctxt->node, prefix);

    /*
     * allocate the node
     */
    if (ctxt->freeAttrs != NULL) {
        ret = ctxt->freeAttrs;
	ctxt->freeAttrs = ret->next;
	ctxt->freeAttrsNr--;
	memset(ret, 0, sizeof(xmlAttr));
	ret->type = XML_ATTRIBUTE_NODE;

	ret->parent = ctxt->node;
	ret->doc = ctxt->myDoc;
	ret->ns = namespace;

	if (ctxt->dictNames)
	    ret->name = localname;
	else
	    ret->name = xmlStrdup(localname);

        /* link at the end to preserve order, TODO speed up with a last */
	if (ctxt->node->properties == NULL) {
	    ctxt->node->properties = ret;
	} else {
	    xmlAttrPtr prev = ctxt->node->properties;

	    while (prev->next != NULL) prev = prev->next;
	    prev->next = ret;
	    ret->prev = prev;
	}

	if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	    xmlRegisterNodeDefaultValue((xmlNodePtr)ret);
    } else {
	if (ctxt->dictNames)
	    ret = xmlNewNsPropEatName(ctxt->node, namespace,
	                              (xmlChar *) localname, NULL);
	else
	    ret = xmlNewNsProp(ctxt->node, namespace, localname, NULL);
	if (ret == NULL) {
	    xmlErrMemory(ctxt, "xmlSAX2AttributeNs");
	    return;
	}
    }

    if ((ctxt->replaceEntities == 0) && (!ctxt->html)) {
	xmlNodePtr tmp;

	/*
	 * We know that if there is an entity reference, then
	 * the string has been dup'ed and terminates with 0
	 * otherwise with ' or "
	 */
	if (*valueend != 0) {
	    tmp = xmlSAX2TextNode(ctxt, value, valueend - value);
	    ret->children = tmp;
	    ret->last = tmp;
	    if (tmp != NULL) {
		tmp->doc = ret->doc;
		tmp->parent = (xmlNodePtr) ret;
	    }
	} else {
	    ret->children = xmlStringLenGetNodeList(ctxt->myDoc, value,
						    valueend - value);
	    tmp = ret->children;
	    while (tmp != NULL) {
	        tmp->doc = ret->doc;
		tmp->parent = (xmlNodePtr) ret;
		if (tmp->next == NULL)
		    ret->last = tmp;
		tmp = tmp->next;
	    }
	}
    } else if (value != NULL) {
	xmlNodePtr tmp;

	tmp = xmlSAX2TextNode(ctxt, value, valueend - value);
	ret->children = tmp;
	ret->last = tmp;
	if (tmp != NULL) {
	    tmp->doc = ret->doc;
	    tmp->parent = (xmlNodePtr) ret;
	}
    }

#ifdef LIBXML_VALID_ENABLED
    if ((!ctxt->html) && ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset) {
	/*
	 * If we don't substitute entities, the validation should be
	 * done on a value with replaced entities anyway.
	 */
        if (!ctxt->replaceEntities) {
	    dup = xmlSAX2DecodeAttrEntities(ctxt, value, valueend);
	    if (dup == NULL) {
	        if (*valueend == 0) {
		    ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
				    ctxt->myDoc, ctxt->node, ret, value);
		} else {
		    /*
		     * That should already be normalized.
		     * cheaper to finally allocate here than duplicate
		     * entry points in the full validation code
		     */
		    dup = xmlStrndup(value, valueend - value);

		    ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
				    ctxt->myDoc, ctxt->node, ret, dup);
		}
	    } else {
	        /*
		 * dup now contains a string of the flattened attribute
		 * content with entities substituted. Check if we need to
		 * apply an extra layer of normalization.
		 * It need to be done twice ... it's an extra burden related
		 * to the ability to keep references in attributes
		 */
		if (ctxt->attsSpecial != NULL) {
		    xmlChar *nvalnorm;
		    xmlChar fn[50];
		    xmlChar *fullname;

		    fullname = xmlBuildQName(localname, prefix, fn, 50);
		    if (fullname != NULL) {
			ctxt->vctxt.valid = 1;
		        nvalnorm = xmlValidCtxtNormalizeAttributeValue(
			                 &ctxt->vctxt, ctxt->myDoc,
					 ctxt->node, fullname, dup);
			if (ctxt->vctxt.valid != 1)
			    ctxt->valid = 0;

			if ((fullname != fn) && (fullname != localname))
			    xmlFree(fullname);
			if (nvalnorm != NULL) {
			    xmlFree(dup);
			    dup = nvalnorm;
			}
		    }
		}

		ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
			        ctxt->myDoc, ctxt->node, ret, dup);
	    }
	} else {
	    /*
	     * if entities already have been substituted, then
	     * the attribute as passed is already normalized
	     */
	    dup = xmlStrndup(value, valueend - value);

	    ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
	                             ctxt->myDoc, ctxt->node, ret, dup);
	}
    } else
#endif /* LIBXML_VALID_ENABLED */
           if (((ctxt->loadsubset & XML_SKIP_IDS) == 0) &&
	       (((ctxt->replaceEntities == 0) && (ctxt->external != 2)) ||
	        ((ctxt->replaceEntities != 0) && (ctxt->inSubset == 0))) &&
               /* Don't create IDs containing entity references */
               (ret->children != NULL) &&
               (ret->children->type == XML_TEXT_NODE) &&
               (ret->children->next == NULL)) {
        xmlChar *content = ret->children->content;
        /*
	 * when validating, the ID registration is done at the attribute
	 * validation level. Otherwise we have to do specific handling here.
	 */
        if ((prefix == ctxt->str_xml) &&
	           (localname[0] == 'i') && (localname[1] == 'd') &&
		   (localname[2] == 0)) {
	    /*
	     * Add the xml:id value
	     *
	     * Open issue: normalization of the value.
	     */
#if defined(LIBXML_SAX1_ENABLED) || defined(LIBXML_HTML_ENABLED) || defined(LIBXML_WRITER_ENABLED) || defined(LIBXML_LEGACY_ENABLED)
#ifdef LIBXML_VALID_ENABLED
	    if (xmlValidateNCName(content, 1) != 0) {
	        xmlErrValid(ctxt, XML_DTD_XMLID_VALUE,
		      "xml:id : attribute value %s is not an NCName\n",
			    (const char *) content, NULL);
	    }
#endif
#endif
	    xmlAddID(&ctxt->vctxt, ctxt->myDoc, content, ret);
	} else if (xmlIsID(ctxt->myDoc, ctxt->node, ret)) {
	    xmlAddID(&ctxt->vctxt, ctxt->myDoc, content, ret);
	} else if (xmlIsRef(ctxt->myDoc, ctxt->node, ret)) {
	    xmlAddRef(&ctxt->vctxt, ctxt->myDoc, content, ret);
	}
    }
    if (dup != NULL)
	xmlFree(dup);
}